

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::CeilCase::compare(CeilCase *this,void **inputs,void **outputs)

{
  bool bVar1;
  StorageType_conflict SVar2;
  reference pvVar3;
  ostream *poVar4;
  Hex<8UL> hex;
  float fVar5;
  deUint32 local_a4;
  Float<unsigned_int,_8,_23,_127,_3U> local_8c;
  uint local_88;
  deUint32 local_84;
  int ulpDiff_2;
  deUint32 ulpDiff_1;
  int roundedVal;
  int iStack_74;
  bool anyOk;
  int maxRes;
  int minRes;
  float out0_1;
  float in0_1;
  int compNdx_1;
  float eps;
  deUint32 maxUlpDiff;
  int mantissaBits;
  HexFloat local_50;
  deUint32 local_4c;
  float local_48;
  deUint32 ulpDiff;
  float ref;
  float out0;
  float in0;
  int compNdx;
  int scalarSize;
  DataType DStack_2c;
  bool hasZeroSign;
  Precision precision;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  CeilCase *this_local;
  
  _precision = outputs;
  outputs_local = inputs;
  inputs_local = (void **)this;
  pvVar3 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_CommonFunctionCase).m_spec.inputs,0);
  DStack_2c = glu::VarType::getBasicType(&pvVar3->varType);
  pvVar3 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_CommonFunctionCase).m_spec.inputs,0);
  scalarSize = glu::VarType::getPrecision(&pvVar3->varType);
  compNdx._3_1_ = supportsSignedZero(scalarSize);
  in0 = (float)glu::getDataTypeScalarSize(DStack_2c);
  if ((scalarSize == 2) || (scalarSize == 1)) {
    for (out0 = 0.0; (int)out0 < (int)in0; out0 = (float)((int)out0 + 1)) {
      ref = *(float *)((long)*outputs_local + (long)(int)out0 * 4);
      ulpDiff = *(deUint32 *)((long)*_precision + (long)(int)out0 * 4);
      local_48 = deFloatCeil(ref);
      if ((compNdx._3_1_ & 1) == 0) {
        local_a4 = getUlpDiffIgnoreZeroSign((float)ulpDiff,local_48);
      }
      else {
        local_a4 = getUlpDiff((float)ulpDiff,local_48);
      }
      local_4c = local_a4;
      if (local_a4 != 0) {
        poVar4 = std::operator<<((ostream *)&(this->super_CommonFunctionCase).m_failMsg,"Expected ["
                                );
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)out0);
        poVar4 = std::operator<<(poVar4,"] = ");
        HexFloat::HexFloat(&local_50,local_48);
        poVar4 = Functional::operator<<(poVar4,&local_50);
        poVar4 = std::operator<<(poVar4,", got ULP diff ");
        _maxUlpDiff = tcu::toHex<unsigned_int>(local_4c);
        tcu::Format::operator<<(poVar4,_maxUlpDiff);
        return false;
      }
    }
  }
  else {
    eps = (float)getMinMantissaBits(scalarSize);
    compNdx_1 = getMaxUlpDiffFromBits((int)eps);
    in0_1 = getEpsFromBits(1.0,(int)eps);
    for (out0_1 = 0.0; (int)out0_1 < (int)in0; out0_1 = (float)((int)out0_1 + 1)) {
      minRes = *(int *)((long)*outputs_local + (long)(int)out0_1 * 4);
      maxRes = *(int *)((long)*_precision + (long)(int)out0_1 * 4);
      fVar5 = deFloatCeil((float)minRes - in0_1);
      iStack_74 = (int)fVar5;
      fVar5 = deFloatCeil((float)minRes + in0_1);
      roundedVal = (int)fVar5;
      ulpDiff_1._3_1_ = 0;
      for (ulpDiff_2 = iStack_74; ulpDiff_2 <= roundedVal; ulpDiff_2 = ulpDiff_2 + 1) {
        local_84 = getUlpDiffIgnoreZeroSign((float)maxRes,(float)ulpDiff_2);
        if (local_84 <= (uint)compNdx_1) {
          ulpDiff_1._3_1_ = 1;
          break;
        }
      }
      if (((ulpDiff_1._3_1_ & 1) == 0) && (bVar1 = de::inRange<int>(0,iStack_74,roundedVal), bVar1))
      {
        tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_8c,(float)maxRes);
        SVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::bits(&local_8c);
        local_88 = de::abs<int>(SVar2 + 0x80000000);
        ulpDiff_1._3_1_ = local_88 <= (uint)compNdx_1;
      }
      if ((ulpDiff_1._3_1_ & 1) == 0) {
        poVar4 = std::operator<<((ostream *)&(this->super_CommonFunctionCase).m_failMsg,"Expected ["
                                );
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)out0_1);
        poVar4 = std::operator<<(poVar4,"] = [");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iStack_74);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,roundedVal);
        poVar4 = std::operator<<(poVar4,"] with ULP threshold ");
        hex = tcu::toHex<unsigned_int>(compNdx_1);
        tcu::Format::operator<<(poVar4,hex);
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				hasZeroSign		= supportsSignedZero(precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref			= deFloatCeil(in0);

				const deUint32	ulpDiff		= hasZeroSign ? getUlpDiff(out0, ref) : getUlpDiffIgnoreZeroSign(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(deFloatCeil(in0-eps));
				const int		maxRes		= int(deFloatCeil(in0+eps));
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiffIgnoreZeroSign(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk && de::inRange(0, minRes, maxRes))
				{
					// Allow -0 as well.
					const int ulpDiff = de::abs((int)tcu::Float32(out0).bits() - (int)0x80000000u);
					anyOk = ((deUint32)ulpDiff <= maxUlpDiff);
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}